

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O3

GLenum deqp::gls::FboUtil::config::glTarget(Image *img)

{
  GLenum GVar1;
  long lVar2;
  
  lVar2 = __dynamic_cast(img,&Image::typeinfo,&Renderbuffer::typeinfo,0);
  GVar1 = 0x8d41;
  if (lVar2 == 0) {
    lVar2 = __dynamic_cast(img,&Image::typeinfo,&Texture2D::typeinfo,0);
    GVar1 = 0xde1;
    if (lVar2 == 0) {
      lVar2 = __dynamic_cast(img,&Image::typeinfo,&TextureCubeMap::typeinfo,0);
      GVar1 = 0x8513;
      if (lVar2 == 0) {
        lVar2 = __dynamic_cast(img,&Image::typeinfo,&Texture3D::typeinfo,0);
        GVar1 = 0x806f;
        if (lVar2 == 0) {
          lVar2 = __dynamic_cast(img,&Image::typeinfo,&Texture2DArray::typeinfo,0);
          GVar1 = 0x8c1a;
          if (lVar2 == 0) {
            GVar1 = 0;
          }
        }
      }
    }
  }
  return GVar1;
}

Assistant:

static GLenum glTarget (const Image& img)
{
	if (dynamic_cast<const Renderbuffer*>(&img) != DE_NULL)
		return GL_RENDERBUFFER;
	if (dynamic_cast<const Texture2D*>(&img) != DE_NULL)
		return GL_TEXTURE_2D;
	if (dynamic_cast<const TextureCubeMap*>(&img) != DE_NULL)
		return GL_TEXTURE_CUBE_MAP;
	if (dynamic_cast<const Texture3D*>(&img) != DE_NULL)
		return GL_TEXTURE_3D;
	if (dynamic_cast<const Texture2DArray*>(&img) != DE_NULL)
		return GL_TEXTURE_2D_ARRAY;

	DE_FATAL("Impossible image type");
	return GL_NONE;
}